

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-analyze.c
# Opt level: O0

_Bool borg_item_has_negative_flag(borg_item_conflict *item)

{
  int index;
  obj_property *poVar1;
  obj_property *flag;
  size_t i;
  borg_item_conflict *item_local;
  
  index = flag_next(item->flags,5,1);
  while( true ) {
    flag = (obj_property *)(long)index;
    if (flag == (obj_property *)0x0) {
      return false;
    }
    poVar1 = lookup_obj_property(3,index);
    if ((poVar1 != (obj_property *)0x0) && (poVar1->power < L'\0')) break;
    index = flag_next(item->flags,5,index + 1);
  }
  return true;
}

Assistant:

static bool borg_item_has_negative_flag(const borg_item* item)
{
    size_t i;
    for (i = of_next(item->flags, FLAG_START); i != FLAG_END;
        i = of_next(item->flags, i + 1)) {

        /* Get the flag details */
        struct obj_property* flag = lookup_obj_property(OBJ_PROPERTY_FLAG, i);
        if (flag && flag->power < 0)
            return true;
    }
    return false;
}